

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_tran_perf(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  nng_time nVar5;
  nng_time nVar6;
  nng_time nVar7;
  double dVar8;
  undefined1 auVar9 [16];
  nng_err result__11;
  nng_err result__10;
  int i;
  nng_err result__9;
  nng_err result__8;
  int num;
  int rv;
  nng_duration delta;
  nng_time end;
  nng_time now;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_msg *msg;
  char *addr;
  nng_socket s2;
  nng_socket s1;
  char *scheme_local;
  
  _s2 = scheme;
  pcVar4 = strchr(scheme,0x36);
  if ((pcVar4 == (char *)0x0) || (_Var1 = nuts_has_ipv6(), _Var1)) {
    nuts_set_logger(5);
    nVar2 = nng_pair1_open((nng_socket *)((long)&addr + 4));
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x218,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4
                           ,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_pair1_open((nng_socket *)&addr);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x219,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar4
                           ,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nuts_scratch_addr_zero(_s2,0x40,nuts_tran_perf::nuts_addr_);
    msg = (nng_msg *)nuts_tran_perf::nuts_addr_;
    nVar2 = nng_socket_set_ms(addr._4_4_,"send-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x21b,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms(addr._0_4_,"send-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x21c,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms(addr._4_4_,"recv-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x21d,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_set_ms(addr._0_4_,"recv-timeout",100);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x21e,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100)",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nuts_marry_ex(addr._4_4_,addr._0_4_,(char *)msg,(nng_pipe *)0x0,(nng_pipe *)0x0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x21f,"%s: expected success, got %s (%d)",
                           "nuts_marry_ex(s1, s2, addr, ((void*)0), ((void*)0))",pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_msg_alloc((nng_msg **)&result__1,0x40);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x220,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 64)",
                           pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nng_log_notice(_s2,"Exchanging 64 byte messages for 10 seconds");
    nVar5 = nng_clock();
    _rv = nVar5 + 10000;
    result__9 = NNG_OK;
    while (nVar6 = nng_clock(), nVar6 < _rv) {
      nVar2 = nng_sendmsg(addr._4_4_,_result__1,0);
      if (nVar2 != NNG_OK) {
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x22b,"%s: expected success, got %s (%d)","rv",pcVar4,nVar2);
        if (iVar3 == 0) {
          acutest_abort_();
        }
        acutest_message_("nng_sendmsg failed");
        break;
      }
      nVar2 = nng_recvmsg(addr._0_4_,(nng_msg **)&result__1,0);
      if (nVar2 != NNG_OK) {
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x230,"%s: expected success, got %s (%d)","rv",pcVar4,nVar2);
        if (iVar3 == 0) {
          acutest_abort_();
        }
        acutest_message_("nng_recvmsg failed");
        break;
      }
      result__9 = result__9 + NNG_EINTR;
    }
    nVar6 = nng_clock();
    nng_msg_free(_result__1);
    nVar7 = nng_clock();
    for (result__11 = NNG_OK; (int)result__11 < (int)result__9; result__11 = result__11 + NNG_EINTR)
    {
      _rv = nng_clock();
      if ((_rv < nVar7) &&
         (iVar3 = acutest_check_((uint)(nVar7 <= _rv),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x23e,"%s","end >= now"), iVar3 == 0)) {
        acutest_abort_();
      }
    }
    iVar3 = acutest_check_((uint)(nVar7 <= _rv),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x241,"%s","end >= now");
    if (iVar3 == 0) {
      acutest_abort_();
    }
    iVar3 = acutest_check_((uint)(_rv - nVar7 < 10000),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x242,"%s","end - now < 10000");
    if (iVar3 == 0) {
      acutest_abort_();
    }
    end._0_4_ = (int)nVar7;
    iVar3 = ((int)nVar6 - (int)nVar5) + ((int)end - rv);
    dVar8 = (double)iVar3 / 1000.0;
    nng_log_notice(_s2,"Did %u roundtrips in %0.2f seconds (%0.3f msg/sec)",dVar8,
                   (double)(int)result__9 / dVar8);
    nng_log_notice(_s2,"RTT %0.3f ms",(double)((float)iVar3 / (float)(int)result__9));
    _rv = _rv - nVar7;
    auVar9._8_4_ = (int)(_rv >> 0x20);
    auVar9._0_8_ = _rv;
    auVar9._12_4_ = 0x45300000;
    nng_log_notice(_s2,"Timing overhead %0.3f ms, %0.3f us/msg",(double)_rv,
                   (((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_rv) - 4503599627370496.0)) * 1000.0) /
                   (double)(int)result__9);
    nVar2 = nng_socket_close(addr._4_4_);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x24b,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_socket_close(addr._0_4_);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x24c,"%s: expected success, got %s (%d)","nng_socket_close(s2)",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
  }
  else {
    acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                  ,0x216,"No IPv6 support present");
  }
  return;
}

Assistant:

void
nuts_tran_perf(const char *scheme)
{
	nng_socket  s1;
	nng_socket  s2;
	const char *addr;
	nng_msg    *msg;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	nuts_set_logger(NNG_LOG_NOTICE);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 100));
	NUTS_MARRY_EX(s1, s2, addr, NULL, NULL);
	NUTS_PASS(nng_msg_alloc(&msg, 64));
	nng_log_notice(scheme, "Exchanging 64 byte messages for 10 seconds");
	nng_time     now = nng_clock();
	nng_time     end = now + 10000; // ten seconds
	nng_duration delta;
	int          rv;
	int          num = 0;

	// count round trips for 10 seconds
	while (nng_clock() < end) {
		if ((rv = nng_sendmsg(s1, msg, 0)) != 0) {
			NUTS_PASS(rv);
			NUTS_MSG("nng_sendmsg failed");
			break;
		}
		if ((rv = nng_recvmsg(s2, &msg, 0)) != 0) {
			NUTS_PASS(rv);
			NUTS_MSG("nng_recvmsg failed");
			break;
		}
		num++;
	}
	delta = (nng_clock() - now);
	nng_msg_free(msg);

	// now count the cost of the time collection
	now = nng_clock();
	for (int i = 0; i < num; i++) {
		end = nng_clock();
		if (end < now) {
			NUTS_ASSERT(end >= now);
		}
	}
	NUTS_ASSERT(end >= now);
	NUTS_ASSERT(end - now < 10000);
	// remove the cost of timing
	delta -= (end - now);
	nng_log_notice(scheme,
	    "Did %u roundtrips in %0.2f seconds (%0.3f msg/sec)", num,
	    delta / 1000.0, (float) num / (delta / 1000.0));
	nng_log_notice(scheme, "RTT %0.3f ms", (float) delta / (float) num);
	nng_log_notice(scheme, "Timing overhead %0.3f ms, %0.3f us/msg",
	    (float) (end - now), (end - now) * 1000.0 / (float) num);
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}